

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O2

int parse_canframe(char *cs,cu_t *cu)

{
  char c;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  uchar uVar5;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uStack_70;
  int local_54;
  
  sVar6 = strlen(cs);
  memset(cu,0,0x810);
  if ((int)sVar6 < 4) {
    return 0;
  }
  if (cs[3] == '#') {
    uVar11 = 0;
    bVar4 = 8;
    uVar10 = 4;
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      bVar3 = asc2nibble(cs[lVar9]);
      if (0xf < bVar3) {
        return 0;
      }
      uVar11 = uVar11 | (uint)bVar3 << (bVar4 & 0x1f);
      (cu->cc).can_id = uVar11;
      bVar4 = bVar4 - 4;
    }
  }
  else {
    if (cs[5] == '#') {
      bVar4 = 0x10;
      uVar11 = 0;
      for (lVar9 = 0; lVar9 != 5; lVar9 = lVar9 + 1) {
        bVar3 = asc2nibble(cs[lVar9]);
        if (0xf < bVar3) {
          return 0;
        }
        uVar11 = uVar11 | (uint)bVar3 << (bVar4 & 0x1f);
        (cu->cc).can_id = uVar11;
        bVar4 = bVar4 - 4;
      }
      uVar11 = uVar11 & 0x7ff | (uVar11 & 0xff000) << 4;
      uStack_70 = 6;
    }
    else {
      if (cs[8] != '#') {
        return 0;
      }
      bVar4 = 0x1c;
      uVar11 = 0;
      for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
        bVar3 = asc2nibble(cs[lVar9]);
        if (0xf < bVar3) {
          return 0;
        }
        uVar11 = uVar11 | (uint)bVar3 << (bVar4 & 0x1f);
        (cu->cc).can_id = uVar11;
        bVar4 = bVar4 - 4;
      }
      if ((uVar11 >> 0x1d & 1) != 0) {
        uVar10 = 9;
        goto LAB_001016ed;
      }
      uVar11 = uVar11 | 0x80000000;
      uStack_70 = 9;
    }
    (cu->cc).can_id = uVar11;
    uVar10 = uStack_70;
  }
LAB_001016ed:
  c = cs[uVar10];
  if (c == '#') {
    bVar4 = asc2nibble(cs[uVar10 + 1]);
    if (0xf < bVar4) {
      return 0;
    }
    (cu->cc).__pad = bVar4 | 4;
    uVar10 = (ulong)((int)uVar10 + 2);
    uStack_70 = 8;
    local_54 = 0x48;
    uVar11 = 0x40;
    bVar2 = false;
    bVar1 = false;
  }
  else {
    if ((c == 'r') || (c == 'R')) {
      (cu->cc).can_id = uVar11 | 0x40000000;
      if (cs[uVar10 + 1] == '\0') {
        return 0x10;
      }
      bVar4 = asc2nibble(cs[uVar10 + 1]);
      if (8 < bVar4) {
        return 0x10;
      }
      (cu->fd).len = bVar4;
      if (bVar4 != 8) {
        return 0x10;
      }
      if (cs[uVar10 + 2] != '_') {
        return 0x10;
      }
      uVar5 = asc2nibble(cs[uVar10 + 3]);
      local_54 = 0x10;
      if (6 < (byte)(uVar5 - 9)) {
        return 0x10;
      }
      goto LAB_001019eb;
    }
    if (cs[uVar10 + 0xe] == '#') {
      if (cs[uVar10 + 2] != ':') {
        return 0;
      }
      if (cs[uVar10 + 5] != ':') {
        return 0;
      }
      bVar4 = asc2nibble(c);
      if (0xf < bVar4) {
        return 0;
      }
      (cu->fd).len = bVar4 << 4;
      bVar3 = asc2nibble(cs[uVar10 + 1]);
      if (0xf < bVar3) {
        return 0;
      }
      (cu->fd).len = bVar4 << 4 | bVar3 | 0x80;
      bVar4 = asc2nibble(cs[uVar10 + 3]);
      if (0xf < bVar4) {
        return 0;
      }
      (cu->cc).__pad = bVar4 << 4;
      bVar3 = asc2nibble(cs[uVar10 + 4]);
      if (0xf < bVar3) {
        return 0;
      }
      (cu->cc).__pad = bVar3 | bVar4 << 4;
      uVar11 = 0;
      for (iVar8 = 0x1c; iVar8 != -4; iVar8 = iVar8 + -4) {
        bVar4 = asc2nibble(cs[uVar10 + 6]);
        if (0xf < bVar4) {
          return 0;
        }
        uVar11 = uVar11 | (uint)bVar4 << ((byte)iVar8 & 0x1f);
        (cu->xl).af = uVar11;
        uVar10 = uVar10 + 1;
      }
      uStack_70 = 0xc;
      local_54 = 0x80c;
      bVar1 = true;
      uVar11 = 0x800;
      bVar2 = false;
      uVar10 = (ulong)((int)uVar10 + 7);
    }
    else {
      uVar11 = 8;
      uStack_70 = 8;
      local_54 = 0x10;
      bVar2 = true;
      bVar1 = false;
    }
  }
  uVar7 = 0;
  while ((iVar8 = (int)uVar10, uVar10 = (ulong)uVar11, uVar11 != uVar7 &&
         (iVar8 = iVar8 + (uint)(cs[iVar8] == '.'), uVar10 = uVar7, iVar8 < (int)sVar6))) {
    bVar4 = asc2nibble(cs[iVar8]);
    if (0xf < bVar4) {
      return 0;
    }
    cu->field3[uVar7 + uStack_70] = bVar4 << 4;
    bVar3 = asc2nibble(cs[(long)iVar8 + 1]);
    if (0xf < bVar3) {
      return 0;
    }
    cu->field3[uVar7 + uStack_70] = bVar3 | bVar4 << 4;
    uVar7 = uVar7 + 1;
    uVar10 = (ulong)(iVar8 + 2);
  }
  if (bVar1) {
    (cu->xl).len = (__u16)uVar10;
  }
  else {
    (cu->fd).len = (__u8)uVar10;
  }
  if (((!bVar2 || (int)uVar10 != 8) || (cs[iVar8] != '_')) ||
     (uVar5 = asc2nibble(cs[(long)iVar8 + 1]), 6 < (byte)(uVar5 - 9))) {
    return local_54;
  }
LAB_001019eb:
  (cu->cc).len8_dlc = uVar5;
  return local_54;
}

Assistant:

int parse_canframe(char *cs, cu_t *cu)
{
	/* documentation see lib.h */

	int i, idx, dlen, len;
	int maxdlen = CAN_MAX_DLEN;
	int mtu = CAN_MTU;
	__u8 *data = cu->fd.data; /* fill CAN CC/FD data by default */
	canid_t tmp;

	len = strlen(cs);
	//printf("'%s' len %d\n", cs, len);

	memset(cu, 0, sizeof(*cu)); /* init CAN CC/FD/XL frame, e.g. LEN = 0 */

	if (len < 4)
		return 0;

	if (cs[3] == CANID_DELIM) { /* 3 digits SFF */

		idx = 4;
		for (i = 0; i < 3; i++) {
			if ((tmp = asc2nibble(cs[i])) > 0x0F)
				return 0;
			cu->cc.can_id |= tmp << (2 - i) * 4;
		}

	} else if (cs[5] == CANID_DELIM) { /* 5 digits CAN XL VCID/PRIO*/

		idx = 6;
		for (i = 0; i < 5; i++) {
			if ((tmp = asc2nibble(cs[i])) > 0x0F)
				return 0;
			cu->xl.prio |= tmp << (4 - i) * 4;
		}

		/* the VCID starts at bit position 16 */
		tmp = (cu->xl.prio << 4) & CANXL_VCID_MASK;
		cu->xl.prio &= CANXL_PRIO_MASK;
		cu->xl.prio |= tmp;

	} else if (cs[8] == CANID_DELIM) { /* 8 digits EFF */

		idx = 9;
		for (i = 0; i < 8; i++) {
			if ((tmp = asc2nibble(cs[i])) > 0x0F)
				return 0;
			cu->cc.can_id |= tmp << (7 - i) * 4;
		}
		if (!(cu->cc.can_id & CAN_ERR_FLAG)) /* 8 digits but no errorframe?  */
			cu->cc.can_id |= CAN_EFF_FLAG;   /* then it is an extended frame */

	} else
		return 0;

	if ((cs[idx] == 'R') || (cs[idx] == 'r')) { /* RTR frame */
		cu->cc.can_id |= CAN_RTR_FLAG;

		/* check for optional DLC value for CAN 2.0B frames */
		if (cs[++idx] && (tmp = asc2nibble(cs[idx++])) <= CAN_MAX_DLEN) {
			cu->cc.len = tmp;

			/* check for optional raw DLC value for CAN 2.0B frames */
			if ((tmp == CAN_MAX_DLEN) && (cs[idx++] == CC_DLC_DELIM)) {
				tmp = asc2nibble(cs[idx]);
				if ((tmp > CAN_MAX_DLEN) && (tmp <= CAN_MAX_RAW_DLC))
					cu->cc.len8_dlc = tmp;
			}
		}
		return mtu;
	}

	if (cs[idx] == CANID_DELIM) { /* CAN FD frame escape char '##' */
		maxdlen = CANFD_MAX_DLEN;
		mtu = CANFD_MTU;

		/* CAN FD frame <canid>##<flags><data>* */
		if ((tmp = asc2nibble(cs[idx + 1])) > 0x0F)
			return 0;

		cu->fd.flags = tmp;
		cu->fd.flags |= CANFD_FDF; /* dual-use */
		idx += 2;

	} else if (cs[idx + 14] == CANID_DELIM) { /* CAN XL frame '#80:00:11223344#' */
		maxdlen = CANXL_MAX_DLEN;
		mtu = CANXL_MTU;
		data = cu->xl.data; /* fill CAN XL data */

		if ((cs[idx + 2] != XL_HDR_DELIM) || (cs[idx + 5] != XL_HDR_DELIM))
			return 0;

		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		cu->xl.flags = tmp << 4;
		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		cu->xl.flags |= tmp;

		/* force CAN XL flag if it was missing in the ASCII string */
		cu->xl.flags |= CANXL_XLF;

		idx++; /* skip XL_HDR_DELIM */

		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		cu->xl.sdt = tmp << 4;
		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		cu->xl.sdt |= tmp;

		idx++; /* skip XL_HDR_DELIM */

		for (i = 0; i < 8; i++) {
			if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
				return 0;
			cu->xl.af |= tmp << (7 - i) * 4;
		}

		idx++; /* skip CANID_DELIM */
	}

	for (i = 0, dlen = 0; i < maxdlen; i++) {
		if (cs[idx] == DATA_SEPERATOR) /* skip (optional) separator */
			idx++;

		if (idx >= len) /* end of string => end of data */
			break;

		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		data[i] = tmp << 4;
		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		data[i] |= tmp;
		dlen++;
	}

	if (mtu == CANXL_MTU)
		cu->xl.len = dlen;
	else
		cu->fd.len = dlen;

	/* check for extra DLC when having a Classic CAN with 8 bytes payload */
	if ((maxdlen == CAN_MAX_DLEN) && (dlen == CAN_MAX_DLEN) && (cs[idx++] == CC_DLC_DELIM)) {
		unsigned char dlc = asc2nibble(cs[idx]);

		if ((dlc > CAN_MAX_DLEN) && (dlc <= CAN_MAX_RAW_DLC))
			cu->cc.len8_dlc = dlc;
	}

	return mtu;
}